

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O0

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RSI;
  long in_RDI;
  double dVar3;
  int j_11;
  int j_10;
  float sum_4;
  int j_9;
  float max_4;
  int i_13;
  float *ptr_11;
  int q_6;
  int channels_2;
  int h_4;
  int w_5;
  int j_8;
  int i_12;
  float *sumptr_1;
  float *ptr_10;
  int q_5;
  int j_7;
  int i_11;
  float *sumptr;
  float *maxptr_1;
  float *ptr_9;
  int q_4;
  Mat sum_3;
  int j_6;
  int i_10;
  float *maxptr;
  float *ptr_8;
  int q_3;
  Mat max_3;
  int channels_1;
  int h_3;
  int w_4;
  int i_9;
  float *ptr_7;
  int q_2;
  int i_8;
  float *ptr_6;
  int q_1;
  Mat sum_2;
  int i_7;
  float *ptr_5;
  int q;
  Mat max_2;
  int size;
  int channels;
  int h_2;
  int w_3;
  int j_5;
  int j_4;
  float s;
  int j_3;
  float m;
  float *ptr_4;
  int i_6;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_5;
  int j_1;
  float *ptr_2;
  int i_4;
  Mat sum_1;
  int j;
  float *ptr_1;
  int i_3;
  Mat max_1;
  int h;
  int w_1;
  int i_2;
  int i_1;
  float sum;
  int i;
  float max;
  float *ptr;
  int w;
  size_t elemsize;
  int dims;
  Mat *in_stack_fffffffffffff9a0;
  Mat *this_00;
  Mat *in_stack_fffffffffffff9a8;
  float fVar4;
  Mat *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  int _w;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  int local_508;
  int local_504;
  float local_500;
  int local_4fc;
  float local_4f8;
  int local_4f4;
  Mat local_4f0;
  Mat *local_4b0;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  float *local_490;
  Mat local_488;
  float *local_448;
  int local_43c;
  int local_438;
  int local_434;
  float *local_430;
  float *local_428;
  Mat local_420;
  float *local_3e0;
  int local_3d4;
  Mat local_3d0;
  int local_390;
  int local_38c;
  float *local_388;
  Mat local_380;
  float *local_340;
  int local_334;
  Mat local_330;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Mat local_2e0;
  float *local_2a0;
  int local_298;
  int local_294;
  Mat local_290;
  float *local_250;
  int local_244;
  Mat local_240;
  int local_1fc;
  Mat local_1f8;
  float *local_1b8;
  int local_1ac;
  Mat local_1a8;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  float local_14c;
  int local_148;
  float local_144;
  float *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  float *local_128;
  int local_120;
  int local_11c;
  float *local_118;
  int local_10c;
  Mat local_108;
  int local_c4;
  float *local_c0;
  int local_b4;
  undefined4 local_b0;
  Mat local_a0;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  int local_48;
  float local_44;
  float *local_40;
  int local_34;
  size_t local_30;
  int local_24;
  Mat *local_18;
  int local_4;
  
  local_24 = in_RSI->dims;
  local_30 = in_RSI->elemsize;
  if (local_24 == 1) {
    local_34 = in_RSI->w;
    local_40 = Mat::operator_cast_to_float_(in_RSI);
    local_44 = -3.4028235e+38;
    for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
      pfVar2 = std::max<float>(&local_44,local_40 + local_48);
      local_44 = *pfVar2;
    }
    local_4c = 0.0;
    for (local_50 = 0; local_50 < local_34; local_50 = local_50 + 1) {
      dVar3 = std::exp((double)(ulong)(uint)(local_40[local_50] - local_44));
      local_40[local_50] = SUB84(dVar3,0);
      local_4c = local_40[local_50] + local_4c;
    }
    for (local_54 = 0; local_54 < local_34; local_54 = local_54 + 1) {
      local_40[local_54] = local_40[local_54] / local_4c;
    }
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    if ((local_24 == 2) && (*(int *)(in_RDI + 0x80) == 0)) {
      local_58 = in_RSI->w;
      local_5c = in_RSI->h;
      Mat::Mat(&local_a0);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                  (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(size_t)in_stack_fffffffffffff9b0,
                  (Allocator *)in_stack_fffffffffffff9a8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9a0);
      if (bVar1) {
        local_4 = -100;
        local_b0 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff9b0,(float)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
        for (local_b4 = 0; _w = (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20), local_b4 < local_5c
            ; local_b4 = local_b4 + 1) {
          local_c0 = Mat::row(local_18,local_b4);
          for (local_c4 = 0; local_c4 < local_58; local_c4 = local_c4 + 1) {
            pfVar2 = Mat::operator[](&local_a0,local_c4);
            pfVar2 = std::max<float>(pfVar2,local_c0 + local_c4);
            fVar4 = *pfVar2;
            pfVar2 = Mat::operator[](&local_a0,local_c4);
            *pfVar2 = fVar4;
          }
        }
        Mat::Mat(&local_108);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),_w,
                    (size_t)in_stack_fffffffffffff9b0,(Allocator *)in_stack_fffffffffffff9a8);
        fVar4 = (float)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
        bVar1 = Mat::empty(in_stack_fffffffffffff9a0);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff9b0,fVar4);
          for (local_10c = 0; local_10c < local_5c; local_10c = local_10c + 1) {
            local_118 = Mat::row(local_18,local_10c);
            for (local_11c = 0; local_11c < local_58; local_11c = local_11c + 1) {
              fVar4 = local_118[local_11c];
              pfVar2 = Mat::operator[](&local_a0,local_11c);
              dVar3 = std::exp((double)(ulong)(uint)(fVar4 - *pfVar2));
              local_118[local_11c] = SUB84(dVar3,0);
              fVar4 = local_118[local_11c];
              pfVar2 = Mat::operator[](&local_108,local_11c);
              *pfVar2 = fVar4 + *pfVar2;
            }
          }
          for (local_120 = 0; local_120 < local_5c; local_120 = local_120 + 1) {
            local_128 = Mat::row(local_18,local_120);
            for (local_12c = 0; local_12c < local_58; local_12c = local_12c + 1) {
              pfVar2 = Mat::operator[](&local_108,local_12c);
              local_128[local_12c] = local_128[local_12c] / *pfVar2;
            }
          }
          local_4 = 0;
        }
        local_b0 = 1;
        Mat::~Mat((Mat *)0x18047f);
      }
      Mat::~Mat((Mat *)0x18048c);
    }
    else if ((local_24 == 2) && (*(int *)(in_RDI + 0x80) == 1)) {
      local_130 = in_RSI->w;
      local_134 = in_RSI->h;
      local_24 = 2;
      for (local_138 = 0; local_138 < local_134; local_138 = local_138 + 1) {
        local_140 = Mat::row(local_18,local_138);
        local_144 = -3.4028235e+38;
        for (local_148 = 0; local_148 < local_130; local_148 = local_148 + 1) {
          pfVar2 = std::max<float>(&local_144,local_140 + local_148);
          local_144 = *pfVar2;
        }
        local_14c = 0.0;
        for (local_150 = 0; local_150 < local_130; local_150 = local_150 + 1) {
          dVar3 = std::exp((double)(ulong)(uint)(local_140[local_150] - local_144));
          local_140[local_150] = SUB84(dVar3,0);
          local_14c = local_140[local_150] + local_14c;
        }
        for (local_154 = 0; local_154 < local_130; local_154 = local_154 + 1) {
          local_140[local_154] = local_140[local_154] / local_14c;
        }
      }
      local_4 = 0;
    }
    else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 0)) {
      local_158 = in_RSI->w;
      local_15c = in_RSI->h;
      local_160 = in_RSI->c;
      local_164 = local_158 * local_15c;
      Mat::Mat(&local_1a8);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                  (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(int)in_stack_fffffffffffff9b8,
                  (size_t)in_stack_fffffffffffff9b0,(Allocator *)in_stack_fffffffffffff9a8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9a0);
      if (bVar1) {
        local_4 = -100;
        local_b0 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff9b0,(float)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
        for (local_1ac = 0; local_1ac < local_160; local_1ac = local_1ac + 1) {
          Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1f8);
          Mat::~Mat((Mat *)0x180834);
          local_1b8 = pfVar2;
          for (local_1fc = 0; local_1fc < local_164; local_1fc = local_1fc + 1) {
            pfVar2 = Mat::operator[](&local_1a8,local_1fc);
            pfVar2 = std::max<float>(pfVar2,local_1b8 + local_1fc);
            fVar4 = *pfVar2;
            pfVar2 = Mat::operator[](&local_1a8,local_1fc);
            *pfVar2 = fVar4;
          }
        }
        Mat::Mat(&local_240);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                    (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(int)in_stack_fffffffffffff9b8,
                    (size_t)in_stack_fffffffffffff9b0,(Allocator *)in_stack_fffffffffffff9a8);
        bVar1 = Mat::empty(in_stack_fffffffffffff9a0);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff9b0,(float)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
          for (local_244 = 0; local_244 < local_160; local_244 = local_244 + 1) {
            Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_290);
            Mat::~Mat((Mat *)0x180a52);
            local_250 = pfVar2;
            for (local_294 = 0; local_294 < local_164; local_294 = local_294 + 1) {
              fVar4 = local_250[local_294];
              pfVar2 = Mat::operator[](&local_1a8,local_294);
              dVar3 = std::exp((double)(ulong)(uint)(fVar4 - *pfVar2));
              local_250[local_294] = SUB84(dVar3,0);
              fVar4 = local_250[local_294];
              pfVar2 = Mat::operator[](&local_240,local_294);
              *pfVar2 = fVar4 + *pfVar2;
            }
          }
          for (local_298 = 0; local_298 < local_160; local_298 = local_298 + 1) {
            Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_2e0);
            Mat::~Mat((Mat *)0x180c04);
            local_2a0 = pfVar2;
            for (local_2e4 = 0; local_2e4 < local_164; local_2e4 = local_2e4 + 1) {
              pfVar2 = Mat::operator[](&local_240,local_2e4);
              local_2a0[local_2e4] = local_2a0[local_2e4] / *pfVar2;
            }
          }
          local_4 = 0;
        }
        local_b0 = 1;
        Mat::~Mat((Mat *)0x180ce2);
      }
      Mat::~Mat((Mat *)0x180d00);
    }
    else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 1)) {
      local_2e8 = in_RSI->w;
      local_2ec = in_RSI->h;
      local_2f0 = in_RSI->c;
      Mat::Mat(&local_330);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                  (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(int)in_stack_fffffffffffff9b8,
                  (size_t)in_stack_fffffffffffff9b0,(Allocator *)in_stack_fffffffffffff9a8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9a0);
      if (bVar1) {
        local_4 = -100;
        local_b0 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff9b0,(float)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
        for (local_334 = 0; local_334 < local_2f0; local_334 = local_334 + 1) {
          Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_380);
          Mat::~Mat((Mat *)0x180e76);
          local_340 = pfVar2;
          local_388 = Mat::row(&local_330,local_334);
          for (local_38c = 0; local_38c < local_2ec; local_38c = local_38c + 1) {
            for (local_390 = 0; local_390 < local_2e8; local_390 = local_390 + 1) {
              pfVar2 = std::max<float>(local_388 + local_390,local_340 + local_390);
              local_388[local_390] = *pfVar2;
            }
            local_340 = local_340 + local_2e8;
          }
        }
        Mat::Mat(&local_3d0);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                    (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(int)in_stack_fffffffffffff9b8,
                    (size_t)in_stack_fffffffffffff9b0,(Allocator *)in_stack_fffffffffffff9a8);
        bVar1 = Mat::empty(in_stack_fffffffffffff9a0);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff9b0,(float)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
          for (local_3d4 = 0; local_3d4 < local_2f0; local_3d4 = local_3d4 + 1) {
            Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_420);
            Mat::~Mat((Mat *)0x1810bc);
            local_3e0 = pfVar2;
            local_428 = Mat::row(&local_330,local_3d4);
            local_430 = Mat::row(&local_3d0,local_3d4);
            for (local_434 = 0; local_434 < local_2ec; local_434 = local_434 + 1) {
              for (local_438 = 0; local_438 < local_2e8; local_438 = local_438 + 1) {
                dVar3 = std::exp((double)(ulong)(uint)(local_3e0[local_438] - local_428[local_438]))
                ;
                local_3e0[local_438] = SUB84(dVar3,0);
                local_430[local_438] = local_3e0[local_438] + local_430[local_438];
              }
              local_3e0 = local_3e0 + local_2e8;
            }
          }
          for (local_43c = 0; local_43c < local_2f0; local_43c = local_43c + 1) {
            Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_488);
            Mat::~Mat((Mat *)0x1812bd);
            local_448 = pfVar2;
            local_490 = Mat::row(&local_3d0,local_43c);
            for (local_494 = 0; local_494 < local_2ec; local_494 = local_494 + 1) {
              for (local_498 = 0; local_498 < local_2e8; local_498 = local_498 + 1) {
                local_448[local_498] = local_448[local_498] / local_490[local_498];
              }
              local_448 = local_448 + local_2e8;
            }
          }
          local_4 = 0;
        }
        local_b0 = 1;
        Mat::~Mat((Mat *)0x181407);
      }
      Mat::~Mat((Mat *)0x181425);
    }
    else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 2)) {
      local_49c = in_RSI->w;
      local_4a0 = in_RSI->h;
      local_4a4 = in_RSI->c;
      local_24 = 3;
      for (local_4a8 = 0; local_4a8 < local_4a4; local_4a8 = local_4a8 + 1) {
        this_00 = &local_4f0;
        Mat::channel(in_stack_fffffffffffff9a8,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffff9a8 = (Mat *)Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x1814f3);
        local_4b0 = in_stack_fffffffffffff9a8;
        for (local_4f4 = 0; local_4f4 < local_4a0; local_4f4 = local_4f4 + 1) {
          local_4f8 = -3.4028235e+38;
          for (local_4fc = 0; local_4fc < local_49c; local_4fc = local_4fc + 1) {
            pfVar2 = std::max<float>(&local_4f8,
                                     (float *)((long)&local_4b0->data + (long)local_4fc * 4));
            local_4f8 = *pfVar2;
          }
          local_500 = 0.0;
          for (local_504 = 0; local_504 < local_49c; local_504 = local_504 + 1) {
            dVar3 = std::exp((double)(ulong)(uint)(*(float *)((long)&local_4b0->data +
                                                             (long)local_504 * 4) - local_4f8));
            *(float *)((long)&local_4b0->data + (long)local_504 * 4) = SUB84(dVar3,0);
            local_500 = *(float *)((long)&local_4b0->data + (long)local_504 * 4) + local_500;
          }
          for (local_508 = 0; local_508 < local_49c; local_508 = local_508 + 1) {
            *(float *)((long)&local_4b0->data + (long)local_508 * 4) =
                 *(float *)((long)&local_4b0->data + (long)local_508 * 4) / local_500;
          }
          local_4b0 = (Mat *)((long)&local_4b0->data + (long)local_49c * 4);
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            ptr[i] = exp(ptr[i] - max);
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - max[j]);
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - m);
                s += ptr[j];
            }

            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(ptr[i] - max[i]);
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - maxptr[j]);
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - max);
                    sum += ptr[j];
                }

                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}